

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O3

double randn(RandnState *state)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  
  uVar3 = state->g_randn_x << 0xb ^ state->g_randn_x;
  uVar1 = state->g_randn_w;
  uVar4 = uVar3 >> 8 ^ uVar1 >> 0x13 ^ uVar3 ^ uVar1;
  uVar6 = uVar4 >> 4;
  iVar7 = 0xb;
  uVar3 = state->g_randn_y;
  uVar2 = state->g_randn_z;
  do {
    uVar5 = uVar4;
    uVar8 = uVar1;
    uVar9 = uVar2;
    uVar3 = uVar3 << 0xb ^ uVar3;
    uVar4 = uVar3 >> 8 ^ uVar5 >> 0x13 ^ uVar3 ^ uVar5;
    uVar6 = uVar6 + (uVar4 >> 4);
    iVar7 = iVar7 + -1;
    uVar3 = uVar9;
    uVar2 = uVar8;
    uVar1 = uVar5;
  } while (iVar7 != 0);
  state->g_randn_x = uVar9;
  state->g_randn_y = uVar8;
  state->g_randn_z = uVar5;
  state->g_randn_w = uVar4;
  return (double)uVar6 * 3.725290298461914e-09 + -6.0;
}

Assistant:

double randn(RandnState *state) {
  uint32_t t;
  t = state->g_randn_x ^ (state->g_randn_x << 11);
  state->g_randn_x = state->g_randn_y;
  state->g_randn_y = state->g_randn_z;
  state->g_randn_z = state->g_randn_w;
  state->g_randn_w
    = (state->g_randn_w ^ (state->g_randn_w >> 19)) ^ (t ^ (t >> 8));

  uint32_t tmp = state->g_randn_w >> 4;
  for (int i = 0; i < 11; ++i) {
    t = state->g_randn_x ^ (state->g_randn_x << 11);
    state->g_randn_x = state->g_randn_y;
    state->g_randn_y = state->g_randn_z;
    state->g_randn_z = state->g_randn_w;
    state->g_randn_w
      = (state->g_randn_w ^ (state->g_randn_w >> 19)) ^ (t ^ (t >> 8));
    tmp += state->g_randn_w >> 4;
  }
  return tmp / 268435456.0 - 6.0;
}